

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall Equality_parseMath_Test::TestBody(Equality_parseMath_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  allocator<char> local_f9;
  AssertionResult local_f8 [2];
  char *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  char *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  undefined1 local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  AssertionResult gtest_ar_;
  VariablePtr sin;
  VariablePtr sin_initial_value;
  VariablePtr x;
  ModelPtr model;
  ComponentPtr component;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component,"deriv_approx_sin.xml",(allocator<char> *)&x);
  fileContents((string *)local_f8);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)&component);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"sin",(allocator<char> *)&x)
  ;
  libcellml::Component::create((string *)&component);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"x",(allocator<char> *)&sin_initial_value);
  libcellml::Variable::create((string *)&x);
  std::__cxx11::string::~string((string *)local_f8);
  peVar1 = x.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"dimensionless",(allocator<char> *)&sin_initial_value);
  libcellml::Variable::setUnits((string *)peVar1);
  std::__cxx11::string::~string((string *)local_f8);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             x.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"sin_initial_value",(allocator<char> *)&sin);
  libcellml::Variable::create((string *)&sin_initial_value);
  std::__cxx11::string::~string((string *)local_f8);
  peVar1 = sin_initial_value.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"dimensionless",(allocator<char> *)&sin);
  libcellml::Variable::setUnits((string *)peVar1);
  std::__cxx11::string::~string((string *)local_f8);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             sin_initial_value.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"sin",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::create((string *)&sin);
  std::__cxx11::string::~string((string *)local_f8);
  peVar1 = sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"dimensionless",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::setUnits((string *)peVar1);
  std::__cxx11::string::~string((string *)local_f8);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInitialValue
            ((shared_ptr *)
             sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar2 = component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n      <apply><eq/>\n        <apply><diff/>\n          <bvar><ci>x</ci></bvar>\n          <ci>sin</ci>\n        </apply>\n        <apply><cos/>\n          <ci>x</ci>\n        </apply>\n      </apply>\n    </math>\n"
             ,(allocator<char> *)&gtest_ar_);
  libcellml::Component::setMath((string *)peVar2);
  std::__cxx11::string::~string((string *)local_f8);
  libcellml::ComponentEntity::component((ulong)local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"x",&local_f9);
  libcellml::Component::variable((string *)&local_c8);
  local_d8 = local_c8;
  _Stack_d0._M_pi = a_Stack_c0[0]._M_pi;
  local_c8 = (char *)0x0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gtest_ar_.success_ =
       (bool)libcellml::Entity::equals
                       ((shared_ptr *)
                        x.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  std::__cxx11::string::~string((string *)local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_f8,&gtest_ar_.success_,"x->equals(model->component(0)->variable(\"x\"))",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d0,(char *)local_f8[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::ComponentEntity::component((ulong)local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"sin_initial_value",&local_f9);
  libcellml::Component::variable((string *)&local_c8);
  local_d8 = local_c8;
  _Stack_d0._M_pi = a_Stack_c0[0]._M_pi;
  local_c8 = (char *)0x0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gtest_ar_.success_ =
       (bool)libcellml::Entity::equals
                       ((shared_ptr *)
                        sin_initial_value.
                        super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  std::__cxx11::string::~string((string *)local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_f8,&gtest_ar_.success_,
               "sin_initial_value->equals(model->component(0)->variable(\"sin_initial_value\"))",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d1,(char *)local_f8[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::ComponentEntity::component((ulong)local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"sin",&local_f9);
  libcellml::Component::variable((string *)&local_c8);
  local_d8 = local_c8;
  _Stack_d0._M_pi = a_Stack_c0[0]._M_pi;
  local_c8 = (char *)0x0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gtest_ar_.success_ =
       (bool)libcellml::Entity::equals
                       ((shared_ptr *)
                        sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  std::__cxx11::string::~string((string *)local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_f8,&gtest_ar_.success_,"sin->equals(model->component(0)->variable(\"sin\"))",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d2,(char *)local_f8[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::ComponentEntity::component((ulong)&local_d8);
  local_f8[0]._0_8_ = local_d8;
  local_f8[0].message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_d0._M_pi;
  local_d8 = (char *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar3 = libcellml::Entity::equals
                    ((shared_ptr *)
                     component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8[0].message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_f8,&gtest_ar_.success_,"component->equals(model->component(0))","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d4,(char *)local_f8[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sin_initial_value.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, parseMath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("deriv_approx_sin.xml"));

    libcellml::ComponentPtr component = libcellml::Component::create("sin");

    libcellml::VariablePtr x = libcellml::Variable::create("x");
    x->setUnits("dimensionless");
    x->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin_initial_value = libcellml::Variable::create("sin_initial_value");
    sin_initial_value->setUnits("dimensionless");
    sin_initial_value->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin = libcellml::Variable::create("sin");
    sin->setUnits("dimensionless");
    sin->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    sin->setInitialValue(sin_initial_value);

    component->setMath(
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply><eq/>\n"
        "        <apply><diff/>\n"
        "          <bvar><ci>x</ci></bvar>\n"
        "          <ci>sin</ci>\n"
        "        </apply>\n"
        "        <apply><cos/>\n"
        "          <ci>x</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n");

    EXPECT_TRUE(x->equals(model->component(0)->variable("x")));
    EXPECT_TRUE(sin_initial_value->equals(model->component(0)->variable("sin_initial_value")));
    EXPECT_TRUE(sin->equals(model->component(0)->variable("sin")));

    EXPECT_TRUE(component->equals(model->component(0)));
}